

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_null_equal_u16string_literal(void)

{
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48);
  local_a[0] = trial::dynamic::operator==(&local_48,(char16_t (*) [1])0x247fba);
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() == u\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xaa,"void equality_suite::compare_null_equal_u16string_literal()",local_a,&local_49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_98);
  local_5e[0] = trial::dynamic::operator!=(&local_98,(char16_t (*) [1])0x247fba);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() != u\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xab,"void equality_suite::compare_null_equal_u16string_literal()",local_5e,&local_99)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8);
  local_9b[0] = trial::dynamic::operator==(&local_d8,(char16_t (*) [8])L"charlie");
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() == u\"charlie\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xad,"void equality_suite::compare_null_equal_u16string_literal()",local_9b,&local_d9)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_118);
  local_db[0] = trial::dynamic::operator!=(&local_118,(char16_t (*) [8])L"charlie");
  local_119 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable() != u\"charlie\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xae,"void equality_suite::compare_null_equal_u16string_literal()",local_db,&local_119
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  return;
}

Assistant:

void compare_null_equal_u16string_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable() == u"", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable() != u"", true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable() == u"charlie", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable() != u"charlie", true);
}